

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

int exhaustive_mesh_search
              (FULLPEL_MV start_mv,FULLPEL_MOTION_SEARCH_PARAMS *ms_params,int range,int step,
              FULLPEL_MV *best_mv,FULLPEL_MV *second_best_mv)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  buf_2d *pbVar4;
  buf_2d *pbVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  short sVar10;
  ushort uVar11;
  int iVar12;
  FULLPEL_MV FVar13;
  short sVar14;
  ushort uVar15;
  short sVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  FULLPEL_MV FVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  ushort uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  short sVar32;
  uint sads [4];
  uint8_t *addrs [4];
  uint local_68 [4];
  uint8_t *local_58 [5];
  
  pbVar4 = (ms_params->ms_buffers).ref;
  iVar6 = 4;
  if (1 < step) {
    iVar6 = step;
  }
  pbVar5 = (ms_params->ms_buffers).src;
  uVar7 = (uint)start_mv.row;
  iVar29 = (int)start_mv >> 0x10;
  iVar2 = (ms_params->mv_limits).col_max;
  if (iVar29 < iVar2) {
    iVar2 = iVar29;
  }
  iVar24 = (ms_params->mv_limits).col_min;
  if (iVar29 < iVar24) {
    iVar2 = iVar24;
  }
  uVar3 = (ms_params->mv_limits).row_max;
  if ((int)uVar7 < (int)uVar3) {
    uVar3 = uVar7;
  }
  uVar31 = (ms_params->mv_limits).row_min;
  if ((int)uVar7 < (int)uVar31) {
    uVar3 = uVar31;
  }
  iVar29 = pbVar4->stride;
  sVar32 = (short)uVar3;
  *best_mv = (FULLPEL_MV)(iVar2 << 0x10 | uVar3 & 0xffff);
  iVar24 = (int)sVar32;
  iVar21 = (int)(short)iVar2;
  uVar7 = (*ms_params->sdf)(pbVar5->buf,pbVar5->stride,
                            pbVar4->buf + (pbVar4->stride * iVar24 + iVar21),iVar29);
  bVar1 = (ms_params->mv_cost_params).mv_cost_type;
  if (bVar1 < 4) {
    sVar14 = sVar32 - (ms_params->mv_cost_params).full_ref_mv.row;
    uVar15 = sVar14 * 8;
    sVar10 = (short)iVar2 - (ms_params->mv_cost_params).full_ref_mv.col;
    uVar11 = sVar10 * 8;
    switch(bVar1) {
    case 0:
      uVar31 = ((ms_params->mv_cost_params).mvcost[0][(short)uVar15] +
                *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                        (ulong)((uint)(uVar11 != 0) * 4 + (uint)(uVar15 != 0) * 8)) +
               (ms_params->mv_cost_params).mvcost[1][(short)uVar11]) *
               (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
      break;
    case 1:
      uVar27 = sVar14 * -8;
      if ((short)(sVar14 * -8) < 0) {
        uVar27 = uVar15;
      }
      uVar15 = sVar10 * -8;
      if ((short)(sVar10 * -8) < 0) {
        uVar15 = uVar11;
      }
      uVar31 = ((uint)uVar15 + (uint)uVar27) * 4;
      break;
    case 2:
      uVar27 = sVar14 * -8;
      if ((short)(sVar14 * -8) < 0) {
        uVar27 = uVar15;
      }
      uVar15 = sVar10 * -8;
      if ((short)(sVar10 * -8) < 0) {
        uVar15 = uVar11;
      }
      uVar31 = ((uint)uVar15 + (uint)uVar27) * 0xf >> 3;
      break;
    case 3:
      uVar27 = sVar14 * -8;
      if ((short)(sVar14 * -8) < 0) {
        uVar27 = uVar15;
      }
      uVar15 = sVar10 * -8;
      if ((short)(sVar10 * -8) < 0) {
        uVar15 = uVar11;
      }
      uVar31 = (uint)uVar15 + (uint)uVar27;
    }
  }
  else {
    uVar31 = 0;
  }
  uVar31 = uVar31 + uVar7;
  iVar8 = -range;
  iVar12 = (ms_params->mv_limits).row_min - iVar24;
  if (iVar12 == iVar8 || SBORROW4(iVar12,iVar8) != iVar12 + range < 0) {
    iVar12 = iVar8;
  }
  iVar17 = (ms_params->mv_limits).col_min - iVar21;
  if (iVar17 == iVar8 || SBORROW4(iVar17,iVar8) != iVar17 + range < 0) {
    iVar17 = iVar8;
  }
  iVar24 = (ms_params->mv_limits).row_max - iVar24;
  if (range <= iVar24) {
    iVar24 = range;
  }
  iVar21 = (ms_params->mv_limits).col_max - iVar21;
  if (range <= iVar21) {
    iVar21 = range;
  }
  if (iVar12 <= iVar24) {
    iVar8 = (iVar2 + iVar17) * 0x10000;
    uVar7 = iVar12 + uVar3;
    do {
      uVar7 = uVar7 & 0xffff;
      if (iVar17 <= iVar21) {
        FVar22 = (FULLPEL_MV)(iVar8 + uVar7);
        sVar10 = (short)(iVar12 + uVar3);
        iVar26 = (iVar2 + iVar17) * 8;
        iVar28 = iVar17;
        iVar19 = iVar8;
        do {
          if (step < 2) {
            if (iVar21 < iVar28 + 3) {
              if (iVar28 < iVar21) {
                iVar23 = 0;
                iVar30 = iVar26;
                iVar25 = iVar19;
                do {
                  uVar9 = (*ms_params->sdf)(pbVar5->buf,pbVar5->stride,
                                            pbVar4->buf +
                                            ((iVar25 >> 0x10) + pbVar4->stride * (int)sVar10),iVar29
                                           );
                  if (uVar9 < uVar31) {
                    bVar1 = (ms_params->mv_cost_params).mv_cost_type;
                    if (bVar1 < 4) {
                      sVar14 = sVar10 - (ms_params->mv_cost_params).full_ref_mv.row;
                      uVar15 = sVar14 * 8;
                      uVar11 = (short)iVar30 + (ms_params->mv_cost_params).full_ref_mv.col * -8;
                      switch(bVar1) {
                      case 0:
                        uVar18 = ((ms_params->mv_cost_params).mvcost[0][(short)uVar15] +
                                  *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                          (ulong)((uint)(uVar11 != 0) * 4 + (uint)(uVar15 != 0) * 8)
                                          ) + (ms_params->mv_cost_params).mvcost[1][(short)uVar11])
                                 * (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
                        break;
                      case 1:
                        uVar27 = sVar14 * -8;
                        if ((short)(sVar14 * -8) < 0) {
                          uVar27 = uVar15;
                        }
                        uVar15 = -uVar11;
                        if (0 < (short)uVar11) {
                          uVar15 = uVar11;
                        }
                        uVar18 = ((uint)uVar15 + (uint)uVar27) * 4;
                        break;
                      case 2:
                        uVar27 = sVar14 * -8;
                        if ((short)(sVar14 * -8) < 0) {
                          uVar27 = uVar15;
                        }
                        uVar15 = -uVar11;
                        if (0 < (short)uVar11) {
                          uVar15 = uVar11;
                        }
                        uVar18 = ((uint)uVar15 + (uint)uVar27) * 0xf >> 3;
                        break;
                      case 3:
                        uVar27 = sVar14 * -8;
                        if ((short)(sVar14 * -8) < 0) {
                          uVar27 = uVar15;
                        }
                        uVar15 = -uVar11;
                        if (0 < (short)uVar11) {
                          uVar15 = uVar11;
                        }
                        uVar18 = (uint)uVar15 + (uint)uVar27;
                      }
                    }
                    else {
                      uVar18 = 0;
                    }
                    if (uVar18 + uVar9 < uVar31) {
                      if (second_best_mv != (FULLPEL_MV *)0x0) {
                        *second_best_mv = *best_mv;
                      }
                      *best_mv = (FULLPEL_MV)(uVar7 + iVar25);
                      uVar31 = uVar18 + uVar9;
                    }
                  }
                  iVar23 = iVar23 + 1;
                  iVar25 = iVar25 + 0x10000;
                  iVar30 = iVar30 + 8;
                } while (iVar23 < iVar21 - iVar28);
              }
            }
            else {
              iVar30 = pbVar4->stride;
              lVar20 = 0;
              iVar25 = iVar19;
              do {
                local_58[lVar20] =
                     pbVar4->buf + ((iVar25 >> 0x10) + iVar30 * (short)((short)iVar12 + sVar32));
                lVar20 = lVar20 + 1;
                iVar25 = iVar25 + 0x10000;
              } while (lVar20 != 4);
              (*ms_params->sdx4df)(pbVar5->buf,pbVar5->stride,local_58,iVar29,local_68);
              lVar20 = 0;
              iVar30 = iVar26;
              FVar13 = FVar22;
              do {
                if (local_68[lVar20] < uVar31) {
                  bVar1 = (ms_params->mv_cost_params).mv_cost_type;
                  if (bVar1 < 4) {
                    sVar14 = sVar10 - (ms_params->mv_cost_params).full_ref_mv.row;
                    uVar15 = sVar14 * 8;
                    uVar11 = (short)iVar30 + (ms_params->mv_cost_params).full_ref_mv.col * -8;
                    switch(bVar1) {
                    case 0:
                      uVar9 = ((ms_params->mv_cost_params).mvcost[0][(short)uVar15] +
                               *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                       (ulong)((uint)(uVar11 != 0) * 4 + (uint)(uVar15 != 0) * 8)) +
                              (ms_params->mv_cost_params).mvcost[1][(short)uVar11]) *
                              (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
                      break;
                    case 1:
                      uVar27 = sVar14 * -8;
                      if ((short)(sVar14 * -8) < 0) {
                        uVar27 = uVar15;
                      }
                      uVar15 = -uVar11;
                      if (0 < (short)uVar11) {
                        uVar15 = uVar11;
                      }
                      uVar9 = ((uint)uVar15 + (uint)uVar27) * 4;
                      break;
                    case 2:
                      uVar27 = sVar14 * -8;
                      if ((short)(sVar14 * -8) < 0) {
                        uVar27 = uVar15;
                      }
                      uVar15 = -uVar11;
                      if (0 < (short)uVar11) {
                        uVar15 = uVar11;
                      }
                      uVar9 = ((uint)uVar15 + (uint)uVar27) * 0xf >> 3;
                      break;
                    case 3:
                      uVar27 = sVar14 * -8;
                      if ((short)(sVar14 * -8) < 0) {
                        uVar27 = uVar15;
                      }
                      uVar15 = -uVar11;
                      if (0 < (short)uVar11) {
                        uVar15 = uVar11;
                      }
                      uVar9 = (uint)uVar15 + (uint)uVar27;
                    }
                  }
                  else {
                    uVar9 = 0;
                  }
                  uVar9 = uVar9 + local_68[lVar20];
                  if (uVar9 < uVar31) {
                    if (second_best_mv != (FULLPEL_MV *)0x0) {
                      *second_best_mv = *best_mv;
                    }
                    *best_mv = FVar13;
                    uVar31 = uVar9;
                  }
                }
                lVar20 = lVar20 + 1;
                FVar13 = (FULLPEL_MV)((int)FVar13 + 0x10000);
                iVar30 = iVar30 + 8;
              } while (lVar20 != 4);
            }
          }
          else {
            sVar14 = (short)(iVar28 + iVar2);
            uVar9 = (*ms_params->sdf)(pbVar5->buf,pbVar5->stride,
                                      pbVar4->buf + ((int)sVar14 + pbVar4->stride * (int)sVar10),
                                      iVar29);
            if (uVar9 < uVar31) {
              bVar1 = (ms_params->mv_cost_params).mv_cost_type;
              if (bVar1 < 4) {
                sVar16 = sVar10 - (ms_params->mv_cost_params).full_ref_mv.row;
                sVar14 = sVar14 - (ms_params->mv_cost_params).full_ref_mv.col;
                uVar15 = sVar16 * 8;
                uVar11 = sVar14 * 8;
                switch(bVar1) {
                case 0:
                  uVar18 = ((ms_params->mv_cost_params).mvcost[0][(short)uVar15] +
                            *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                    (ulong)((uint)(uVar11 != 0) * 4 + (uint)(uVar15 != 0) * 8)) +
                           (ms_params->mv_cost_params).mvcost[1][(short)uVar11]) *
                           (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
                  break;
                case 1:
                  uVar27 = sVar16 * -8;
                  if ((short)(sVar16 * -8) < 0) {
                    uVar27 = uVar15;
                  }
                  uVar15 = sVar14 * -8;
                  if ((short)(sVar14 * -8) < 0) {
                    uVar15 = uVar11;
                  }
                  uVar18 = ((uint)uVar15 + (uint)uVar27) * 4;
                  break;
                case 2:
                  uVar27 = sVar16 * -8;
                  if ((short)(sVar16 * -8) < 0) {
                    uVar27 = uVar15;
                  }
                  uVar15 = sVar14 * -8;
                  if ((short)(sVar14 * -8) < 0) {
                    uVar15 = uVar11;
                  }
                  uVar18 = ((uint)uVar15 + (uint)uVar27) * 0xf >> 3;
                  break;
                case 3:
                  uVar27 = sVar16 * -8;
                  if ((short)(sVar16 * -8) < 0) {
                    uVar27 = uVar15;
                  }
                  uVar15 = sVar14 * -8;
                  if ((short)(sVar14 * -8) < 0) {
                    uVar15 = uVar11;
                  }
                  uVar18 = (uint)uVar15 + (uint)uVar27;
                }
              }
              else {
                uVar18 = 0;
              }
              if (uVar18 + uVar9 < uVar31) {
                if (second_best_mv != (FULLPEL_MV *)0x0) {
                  *second_best_mv = *best_mv;
                }
                *best_mv = (FULLPEL_MV)((iVar28 + iVar2) * 0x10000 + (iVar12 + uVar3 & 0xffff));
                uVar31 = uVar18 + uVar9;
              }
            }
          }
          iVar28 = iVar28 + iVar6;
          iVar19 = iVar19 + iVar6 * 0x10000;
          FVar22 = (FULLPEL_MV)((int)FVar22 + iVar6 * 0x10000);
          iVar26 = iVar26 + iVar6 * 8;
        } while (iVar28 <= iVar21);
      }
      iVar12 = iVar12 + step;
      uVar7 = uVar7 + step;
    } while (iVar12 <= iVar24);
  }
  return uVar31;
}

Assistant:

static int exhaustive_mesh_search(FULLPEL_MV start_mv,
                                  const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                                  const int range, const int step,
                                  FULLPEL_MV *best_mv,
                                  FULLPEL_MV *second_best_mv) {
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const int ref_stride = ref->stride;
  unsigned int best_sad = INT_MAX;
  int r, c, i;
  int start_col, end_col, start_row, end_row;
  const int col_step = (step > 1) ? step : 4;

  assert(step >= 1);

  clamp_fullmv(&start_mv, &ms_params->mv_limits);
  *best_mv = start_mv;
  best_sad = get_mvpred_sad(ms_params, src, get_buf_from_fullmv(ref, &start_mv),
                            ref_stride);
  best_sad += mvsad_err_cost_(&start_mv, mv_cost_params);
  start_row = AOMMAX(-range, ms_params->mv_limits.row_min - start_mv.row);
  start_col = AOMMAX(-range, ms_params->mv_limits.col_min - start_mv.col);
  end_row = AOMMIN(range, ms_params->mv_limits.row_max - start_mv.row);
  end_col = AOMMIN(range, ms_params->mv_limits.col_max - start_mv.col);

  for (r = start_row; r <= end_row; r += step) {
    for (c = start_col; c <= end_col; c += col_step) {
      // Step > 1 means we are not checking every location in this pass.
      if (step > 1) {
        const FULLPEL_MV mv = { start_mv.row + r, start_mv.col + c };
        unsigned int sad = get_mvpred_sad(
            ms_params, src, get_buf_from_fullmv(ref, &mv), ref_stride);
        update_mvs_and_sad(sad, &mv, mv_cost_params, &best_sad,
                           /*raw_best_sad=*/NULL, best_mv, second_best_mv);
      } else {
        // 4 sads in a single call if we are checking every location
        if (c + 3 <= end_col) {
          unsigned int sads[4];
          const uint8_t *addrs[4];
          for (i = 0; i < 4; ++i) {
            const FULLPEL_MV mv = { start_mv.row + r, start_mv.col + c + i };
            addrs[i] = get_buf_from_fullmv(ref, &mv);
          }

          ms_params->sdx4df(src->buf, src->stride, addrs, ref_stride, sads);

          for (i = 0; i < 4; ++i) {
            if (sads[i] < best_sad) {
              const FULLPEL_MV mv = { start_mv.row + r, start_mv.col + c + i };
              update_mvs_and_sad(sads[i], &mv, mv_cost_params, &best_sad,
                                 /*raw_best_sad=*/NULL, best_mv,
                                 second_best_mv);
            }
          }
        } else {
          for (i = 0; i < end_col - c; ++i) {
            const FULLPEL_MV mv = { start_mv.row + r, start_mv.col + c + i };
            unsigned int sad = get_mvpred_sad(
                ms_params, src, get_buf_from_fullmv(ref, &mv), ref_stride);
            update_mvs_and_sad(sad, &mv, mv_cost_params, &best_sad,
                               /*raw_best_sad=*/NULL, best_mv, second_best_mv);
          }
        }
      }
    }
  }

  return best_sad;
}